

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::RendererImpl<float>::doRenderAndConvertStreams<short>
          (RendererImpl<float> *this,DACOutputStreams<short> *streams,Bit32u len)

{
  float *pfVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  ulong uVar5;
  short *psVar6;
  short *psVar7;
  short *psVar8;
  float fVar9;
  float fVar10;
  DACOutputStreams<float> cnvStreams;
  float cnvReverbWetRight [4096];
  float cnvReverbWetLeft [4096];
  float cnvReverbDryRight [4096];
  float cnvReverbDryLeft [4096];
  float cnvNonReverbRight [4096];
  float cnvNonReverbLeft [4096];
  DACOutputStreams<float> DStack_18078;
  RendererImpl<float> *pRStack_18048;
  short *psStack_18040;
  float afStack_18038 [4096];
  float afStack_14038 [4096];
  float afStack_10038 [4096];
  float local_c038 [4096];
  float local_8038 [4096];
  float local_4038 [4098];
  
  DStack_18078.nonReverbLeft = local_4038;
  DStack_18078.nonReverbRight = local_8038;
  DStack_18078.reverbDryLeft = local_c038;
  DStack_18078.reverbDryRight = afStack_10038;
  DStack_18078.reverbWetLeft = afStack_14038;
  DStack_18078.reverbWetRight = afStack_18038;
  if (len != 0) {
    psStack_18040 = streams->reverbWetRight;
    psVar6 = streams->reverbWetLeft;
    psVar8 = streams->reverbDryRight;
    psVar7 = streams->reverbDryLeft;
    psVar3 = streams->nonReverbLeft;
    psVar2 = streams->nonReverbRight;
    pRStack_18048 = this;
    do {
      uVar5 = 0x1000;
      if (len < 0x1000) {
        uVar5 = (ulong)len;
      }
      doRenderStreams(pRStack_18048,&DStack_18078,(Bit32u)uVar5);
      if (psVar3 != (short *)0x0 && DStack_18078.nonReverbLeft != (float *)0x0) {
        pfVar1 = DStack_18078.nonReverbLeft;
        psVar4 = psVar3;
        do {
          fVar10 = -32768.0;
          if (-32768.0 <= *pfVar1 * 32768.0) {
            fVar10 = *pfVar1 * 32768.0;
          }
          fVar9 = 32767.0;
          if (fVar10 <= 32767.0) {
            fVar9 = fVar10;
          }
          pfVar1 = pfVar1 + 1;
          *psVar4 = (short)(int)fVar9;
          psVar4 = psVar4 + 1;
        } while (pfVar1 < DStack_18078.nonReverbLeft + uVar5);
      }
      if (psVar2 != (short *)0x0 && DStack_18078.nonReverbRight != (float *)0x0) {
        pfVar1 = DStack_18078.nonReverbRight;
        psVar4 = psVar2;
        do {
          fVar10 = -32768.0;
          if (-32768.0 <= *pfVar1 * 32768.0) {
            fVar10 = *pfVar1 * 32768.0;
          }
          fVar9 = 32767.0;
          if (fVar10 <= 32767.0) {
            fVar9 = fVar10;
          }
          pfVar1 = pfVar1 + 1;
          *psVar4 = (short)(int)fVar9;
          psVar4 = psVar4 + 1;
        } while (pfVar1 < DStack_18078.nonReverbRight + uVar5);
      }
      if (psVar7 != (short *)0x0 && DStack_18078.reverbDryLeft != (float *)0x0) {
        pfVar1 = DStack_18078.reverbDryLeft;
        psVar4 = psVar7;
        do {
          fVar10 = -32768.0;
          if (-32768.0 <= *pfVar1 * 32768.0) {
            fVar10 = *pfVar1 * 32768.0;
          }
          fVar9 = 32767.0;
          if (fVar10 <= 32767.0) {
            fVar9 = fVar10;
          }
          pfVar1 = pfVar1 + 1;
          *psVar4 = (short)(int)fVar9;
          psVar4 = psVar4 + 1;
        } while (pfVar1 < DStack_18078.reverbDryLeft + uVar5);
      }
      if (psVar8 != (short *)0x0 && DStack_18078.reverbDryRight != (float *)0x0) {
        pfVar1 = DStack_18078.reverbDryRight;
        psVar4 = psVar8;
        do {
          fVar10 = -32768.0;
          if (-32768.0 <= *pfVar1 * 32768.0) {
            fVar10 = *pfVar1 * 32768.0;
          }
          fVar9 = 32767.0;
          if (fVar10 <= 32767.0) {
            fVar9 = fVar10;
          }
          pfVar1 = pfVar1 + 1;
          *psVar4 = (short)(int)fVar9;
          psVar4 = psVar4 + 1;
        } while (pfVar1 < DStack_18078.reverbDryRight + uVar5);
      }
      if (psVar6 != (short *)0x0 && DStack_18078.reverbWetLeft != (float *)0x0) {
        pfVar1 = DStack_18078.reverbWetLeft;
        psVar4 = psVar6;
        do {
          fVar10 = -32768.0;
          if (-32768.0 <= *pfVar1 * 32768.0) {
            fVar10 = *pfVar1 * 32768.0;
          }
          fVar9 = 32767.0;
          if (fVar10 <= 32767.0) {
            fVar9 = fVar10;
          }
          pfVar1 = pfVar1 + 1;
          *psVar4 = (short)(int)fVar9;
          psVar4 = psVar4 + 1;
        } while (pfVar1 < DStack_18078.reverbWetLeft + uVar5);
      }
      if (psStack_18040 != (short *)0x0 && DStack_18078.reverbWetRight != (float *)0x0) {
        pfVar1 = DStack_18078.reverbWetRight;
        psVar4 = psStack_18040;
        do {
          fVar10 = -32768.0;
          if (-32768.0 <= *pfVar1 * 32768.0) {
            fVar10 = *pfVar1 * 32768.0;
          }
          fVar9 = 32767.0;
          if (fVar10 <= 32767.0) {
            fVar9 = fVar10;
          }
          pfVar1 = pfVar1 + 1;
          *psVar4 = (short)(int)fVar9;
          psVar4 = psVar4 + 1;
        } while (pfVar1 < DStack_18078.reverbWetRight + uVar5);
      }
      if (psVar3 != (short *)0x0) {
        psVar3 = psVar3 + uVar5;
      }
      if (psVar2 != (short *)0x0) {
        psVar2 = psVar2 + uVar5;
      }
      if (psVar7 != (short *)0x0) {
        psVar7 = psVar7 + uVar5;
      }
      if (psVar8 != (short *)0x0) {
        psVar8 = psVar8 + uVar5;
      }
      if (psVar6 != (short *)0x0) {
        psVar6 = psVar6 + uVar5;
      }
      if (psStack_18040 != (short *)0x0) {
        psStack_18040 = psStack_18040 + uVar5;
      }
      len = len - (Bit32u)uVar5;
    } while (len != 0);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvertStreams(const DACOutputStreams<O> &streams, Bit32u len) {
	Sample cnvNonReverbLeft[MAX_SAMPLES_PER_RUN], cnvNonReverbRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbDryLeft[MAX_SAMPLES_PER_RUN], cnvReverbDryRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbWetLeft[MAX_SAMPLES_PER_RUN], cnvReverbWetRight[MAX_SAMPLES_PER_RUN];

	const DACOutputStreams<Sample> cnvStreams = {
		cnvNonReverbLeft, cnvNonReverbRight,
		cnvReverbDryLeft, cnvReverbDryRight,
		cnvReverbWetLeft, cnvReverbWetRight
	};

	DACOutputStreams<O> tmpStreams = streams;

	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(cnvStreams, thisPassLen);
		convertStreamsFormat(cnvStreams, tmpStreams, thisPassLen);
		advanceStreams(tmpStreams, thisPassLen);
		len -= thisPassLen;
	}
}